

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool ON_wString::EqualPath(wchar_t *path1,int element_count1,wchar_t *path2,int element_count2)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint local_48;
  int local_40;
  bool bOrdinalIgnoreCase;
  int i;
  int element_count;
  uint c2;
  uint c1;
  wchar_t null_terminator;
  int element_count2_local;
  wchar_t *path2_local;
  wchar_t *pwStack_18;
  int element_count1_local;
  wchar_t *path1_local;
  
  if (((path1 == (wchar_t *)0x0) && (element_count1 != 0)) ||
     ((path2 == (wchar_t *)0x0 && (element_count2 != 0)))) {
    if (path1 == path2) {
      return true;
    }
    if (path1 == (wchar_t *)0x0) {
      return false;
    }
    if (path2 == (wchar_t *)0x0) {
      return false;
    }
  }
  c2 = 0;
  c1 = element_count2;
  _null_terminator = path2;
  path2_local._4_4_ = element_count1;
  pwStack_18 = path1;
  if (element_count1 < 0) {
    path2_local._4_4_ = Length(path1);
  }
  if ((int)c1 < 0) {
    c1 = Length(_null_terminator);
  }
  if (path2_local._4_4_ == 0) {
    pwStack_18 = (wchar_t *)&c2;
  }
  if (c1 == 0) {
    _null_terminator = (wchar_t *)&c2;
  }
  if ((pwStack_18 != _null_terminator) || (path2_local._4_4_ != c1)) {
    if ((int)c1 < (int)path2_local._4_4_) {
      local_48 = c1;
    }
    else {
      local_48 = path2_local._4_4_;
    }
    bVar1 = ON_FileSystemPath::PlatformPathIgnoreCase();
    if (bVar1) {
      for (local_40 = 0; local_40 < (int)local_48; local_40 = local_40 + 1) {
        wVar2 = *pwStack_18;
        pwStack_18 = pwStack_18 + 1;
        wVar2 = OrdinalWideCharToIgnoreCase(wVar2);
        wVar3 = ON_NormalizeWideCharPathSepartor(wVar2);
        wVar2 = *_null_terminator;
        _null_terminator = _null_terminator + 1;
        wVar2 = OrdinalWideCharToIgnoreCase(wVar2);
        wVar2 = ON_NormalizeWideCharPathSepartor(wVar2);
        if (wVar3 != wVar2) {
          return false;
        }
      }
    }
    else {
      for (local_40 = 0; local_40 < (int)local_48; local_40 = local_40 + 1) {
        wVar2 = *pwStack_18;
        pwStack_18 = pwStack_18 + 1;
        wVar3 = ON_NormalizeWideCharPathSepartor(wVar2);
        wVar2 = *_null_terminator;
        _null_terminator = _null_terminator + 1;
        wVar2 = ON_NormalizeWideCharPathSepartor(wVar2);
        if (wVar3 != wVar2) {
          return false;
        }
      }
    }
    for (; local_40 < (int)path2_local._4_4_; local_40 = local_40 + 1) {
      if (*pwStack_18 != L'\0') {
        return false;
      }
      pwStack_18 = pwStack_18 + 1;
    }
    for (; local_40 < (int)c1; local_40 = local_40 + 1) {
      if (*_null_terminator != L'\0') {
        return false;
      }
      _null_terminator = _null_terminator + 1;
    }
  }
  return true;
}

Assistant:

bool ON_wString::EqualPath(
  const wchar_t* path1,
  int element_count1,
  const wchar_t* path2,
  int element_count2
  )
{
  WIDE_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path1++));
      c2 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor(*path1++);
      c2 = ON_NormalizeWideCharPathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}